

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmNinjaNormalTargetGenerator::ComputeLinkCmd
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,cmNinjaNormalTargetGenerator *this,string *config)

{
  bool bVar1;
  bool bVar2;
  TargetType TVar3;
  cmMakefile *pcVar4;
  cmGeneratorTarget *pcVar5;
  cmLocalNinjaGenerator *pcVar6;
  string *psVar7;
  string_view sVar8;
  allocator<char> local_5b9;
  string local_5b8;
  string local_598;
  string_view local_578;
  string *local_568;
  string *linkCmd_2;
  string local_540;
  string local_520;
  cmAlphaNum local_500;
  cmAlphaNum local_4d0;
  undefined1 local_4a0 [8];
  string linkCmdVar_2;
  string *linkCmd_1;
  string local_448;
  string local_428;
  cmAlphaNum local_408;
  cmAlphaNum local_3d8;
  undefined1 local_3a8 [8];
  string linkCmdVar_1;
  undefined1 local_358 [8];
  string cmakeCommand_1;
  cmAlphaNum local_330;
  cmAlphaNum local_300;
  string local_2d0;
  string local_2b0;
  undefined1 local_290 [8];
  string targetOutputReal;
  string local_260;
  cmAlphaNum local_240;
  string_view local_210;
  string local_200;
  cmAlphaNum local_1e0;
  undefined1 local_1b0 [8];
  string cmakeCommand;
  string local_188;
  cmValue local_168;
  cmValue lwyuCheck;
  cmValue local_150;
  cmValue rule;
  cmAlphaNum local_128;
  cmAlphaNum local_f8;
  undefined1 local_c8 [8];
  string ruleVar;
  string linkCmdStr;
  cmValue linkCmd;
  undefined1 local_60 [8];
  string linkCmdVar;
  cmMakefile *mf;
  string *config_local;
  cmNinjaNormalTargetGenerator *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *linkCmds;
  
  bVar2 = false;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  pcVar4 = cmNinjaTargetGenerator::GetMakefile(&this->super_cmNinjaTargetGenerator);
  pcVar5 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  TargetLinkLanguage((string *)&linkCmd,this,config);
  cmGeneratorTarget::GetCreateRuleVariable((string *)local_60,pcVar5,(string *)&linkCmd,config);
  std::__cxx11::string::~string((string *)&linkCmd);
  linkCmdStr.field_2._8_8_ = cmMakefile::GetDefinition(pcVar4,(string *)local_60);
  bVar1 = cmValue::operator_cast_to_bool((cmValue *)((long)&linkCmdStr.field_2 + 8));
  if (bVar1) {
    psVar7 = cmValue::operator*[abi_cxx11_((cmValue *)((long)&linkCmdStr.field_2 + 8));
    std::__cxx11::string::string((string *)(ruleVar.field_2._M_local_buf + 8),(string *)psVar7);
    pcVar5 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    bVar2 = cmGeneratorTarget::HasImplibGNUtoMS(pcVar5,config);
    if (bVar2) {
      cmAlphaNum::cmAlphaNum(&local_f8,"CMAKE_");
      cmGeneratorTarget::GetLinkerLanguage
                ((string *)&rule,
                 (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
                 config);
      cmAlphaNum::cmAlphaNum(&local_128,(string *)&rule);
      cmStrCat<char[14]>((string *)local_c8,&local_f8,&local_128,(char (*) [14])"_GNUtoMS_RULE");
      std::__cxx11::string::~string((string *)&rule);
      local_150 = cmMakefile::GetDefinition
                            ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                             Makefile,(string *)local_c8);
      bVar2 = cmValue::operator_cast_to_bool(&local_150);
      if (bVar2) {
        psVar7 = cmValue::operator*[abi_cxx11_(&local_150);
        std::__cxx11::string::operator+=
                  ((string *)(ruleVar.field_2._M_local_buf + 8),(string *)psVar7);
      }
      std::__cxx11::string::~string((string *)local_c8);
    }
    sVar8 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view
                      ((string *)(ruleVar.field_2._M_local_buf + 8));
    lwyuCheck.Value = (string *)sVar8._M_len;
    cmExpandList(sVar8,__return_storage_ptr__,false);
    if (((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.UseLWYU & 1U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_188,"CMAKE_LINK_WHAT_YOU_USE_CHECK",
                 (allocator<char> *)(cmakeCommand.field_2._M_local_buf + 0xf));
      local_168 = cmMakefile::GetDefinition(pcVar4,&local_188);
      std::__cxx11::string::~string((string *)&local_188);
      std::allocator<char>::~allocator((allocator<char> *)(cmakeCommand.field_2._M_local_buf + 0xf))
      ;
      bVar2 = cmValue::operator_cast_to_bool(&local_168);
      if (bVar2) {
        pcVar6 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
        psVar7 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
        local_210 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar7);
        cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                  (&local_200,
                   &(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,local_210,SHELL);
        cmAlphaNum::cmAlphaNum(&local_1e0,&local_200);
        cmAlphaNum::cmAlphaNum(&local_240," -E __run_co_compile --lwyu=");
        cmStrCat<>((string *)local_1b0,&local_1e0,&local_240);
        std::__cxx11::string::~string((string *)&local_200);
        pcVar6 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
        psVar7 = cmValue::operator*[abi_cxx11_(&local_168);
        sVar8 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar7);
        targetOutputReal.field_2._8_8_ = sVar8._M_len;
        cmOutputConverter::EscapeForShell_abi_cxx11_
                  (&local_260,
                   &(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,sVar8,false,false,false,false,false);
        std::__cxx11::string::operator+=((string *)local_1b0,(string *)&local_260);
        std::__cxx11::string::~string((string *)&local_260);
        pcVar5 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
        cmGeneratorTarget::GetFullPath(&local_2b0,pcVar5,config,RuntimeBinaryArtifact,true);
        psVar7 = cmNinjaTargetGenerator::ConvertToNinjaPath
                           (&this->super_cmNinjaTargetGenerator,&local_2b0);
        std::__cxx11::string::string((string *)local_290,(string *)psVar7);
        std::__cxx11::string::~string((string *)&local_2b0);
        cmAlphaNum::cmAlphaNum(&local_300," --source=");
        cmAlphaNum::cmAlphaNum(&local_330,(string *)local_290);
        cmStrCat<>(&local_2d0,&local_300,&local_330);
        std::__cxx11::string::operator+=((string *)local_1b0,(string *)&local_2d0);
        std::__cxx11::string::~string((string *)&local_2d0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)local_1b0);
        std::__cxx11::string::~string((string *)local_290);
        std::__cxx11::string::~string((string *)local_1b0);
      }
    }
    bVar2 = true;
    cmakeCommand_1.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)(ruleVar.field_2._M_local_buf + 8));
  }
  else {
    cmakeCommand_1.field_2._12_4_ = 0;
  }
  std::__cxx11::string::~string((string *)local_60);
  if (cmakeCommand_1.field_2._12_4_ == 0) {
    pcVar5 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    TVar3 = cmGeneratorTarget::GetType(pcVar5);
    if (TVar3 == EXECUTABLE) {
      TargetLinkLanguage(&local_598,this,config);
      bVar2 = std::operator==(&local_598,"Swift");
      std::__cxx11::string::~string((string *)&local_598);
      if (bVar2) {
        bVar2 = cmGeneratorTarget::IsExecutableWithExports
                          ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                           GeneratorTarget);
        if (bVar2) {
          pcVar4 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5b8,"CMAKE_EXE_EXPORTS_Swift_FLAG",&local_5b9);
          cmMakefile::GetDefExpandList(pcVar4,&local_5b8,__return_storage_ptr__,false);
          std::__cxx11::string::~string((string *)&local_5b8);
          std::allocator<char>::~allocator(&local_5b9);
        }
      }
    }
    else if (TVar3 == STATIC_LIBRARY) {
      pcVar6 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
      psVar7 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
      sVar8 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar7);
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                ((string *)local_358,
                 &(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,sVar8,SHELL);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&linkCmdVar_1.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358,
                     " -E rm -f $TARGET_FILE");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)((long)&linkCmdVar_1.field_2 + 8));
      std::__cxx11::string::~string((string *)(linkCmdVar_1.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_358);
      cmAlphaNum::cmAlphaNum(&local_3d8,"CMAKE_");
      TargetLinkLanguage(&local_428,this,config);
      cmAlphaNum::cmAlphaNum(&local_408,&local_428);
      cmStrCat<char[16]>((string *)local_3a8,&local_3d8,&local_408,(char (*) [16])"_ARCHIVE_CREATE")
      ;
      std::__cxx11::string::~string((string *)&local_428);
      pcVar5 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
      TargetLinkLanguage((string *)&linkCmd_1,this,config);
      cmGeneratorTarget::GetFeatureSpecificLinkRuleVariable
                (&local_448,pcVar5,(string *)local_3a8,(string *)&linkCmd_1,config);
      std::__cxx11::string::operator=((string *)local_3a8,(string *)&local_448);
      std::__cxx11::string::~string((string *)&local_448);
      std::__cxx11::string::~string((string *)&linkCmd_1);
      psVar7 = cmMakefile::GetRequiredDefinition(pcVar4,(string *)local_3a8);
      sVar8 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar7);
      linkCmdVar_2.field_2._8_8_ = sVar8._M_len;
      cmExpandList(sVar8,__return_storage_ptr__,false);
      std::__cxx11::string::~string((string *)local_3a8);
      cmAlphaNum::cmAlphaNum(&local_4d0,"CMAKE_");
      TargetLinkLanguage(&local_520,this,config);
      cmAlphaNum::cmAlphaNum(&local_500,&local_520);
      cmStrCat<char[16]>((string *)local_4a0,&local_4d0,&local_500,(char (*) [16])"_ARCHIVE_FINISH")
      ;
      std::__cxx11::string::~string((string *)&local_520);
      pcVar5 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
      TargetLinkLanguage((string *)&linkCmd_2,this,config);
      cmGeneratorTarget::GetFeatureSpecificLinkRuleVariable
                (&local_540,pcVar5,(string *)local_4a0,(string *)&linkCmd_2,config);
      std::__cxx11::string::operator=((string *)local_4a0,(string *)&local_540);
      std::__cxx11::string::~string((string *)&local_540);
      std::__cxx11::string::~string((string *)&linkCmd_2);
      local_568 = cmMakefile::GetRequiredDefinition(pcVar4,(string *)local_4a0);
      local_578 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_568);
      cmExpandList(local_578,__return_storage_ptr__,false);
      std::__cxx11::string::~string((string *)local_4a0);
    }
    else if (1 < TVar3 - SHARED_LIBRARY) {
      __assert_fail("false && \"Unexpected target type\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmNinjaNormalTargetGenerator.cxx"
                    ,0x291,
                    "std::vector<std::string> cmNinjaNormalTargetGenerator::ComputeLinkCmd(const std::string &)"
                   );
    }
    bVar2 = true;
    cmakeCommand_1.field_2._12_4_ = 1;
  }
  if (!bVar2) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> cmNinjaNormalTargetGenerator::ComputeLinkCmd(
  const std::string& config)
{
  std::vector<std::string> linkCmds;
  cmMakefile* mf = this->GetMakefile();
  {
    // If we have a rule variable prefer it. In the case of static libraries
    // this occurs when things like IPO is enabled, and we need to use the
    // CMAKE_<lang>_CREATE_STATIC_LIBRARY_IPO define instead.
    std::string linkCmdVar = this->GetGeneratorTarget()->GetCreateRuleVariable(
      this->TargetLinkLanguage(config), config);
    cmValue linkCmd = mf->GetDefinition(linkCmdVar);
    if (linkCmd) {
      std::string linkCmdStr = *linkCmd;
      if (this->GetGeneratorTarget()->HasImplibGNUtoMS(config)) {
        std::string ruleVar =
          cmStrCat("CMAKE_", this->GeneratorTarget->GetLinkerLanguage(config),
                   "_GNUtoMS_RULE");
        if (cmValue rule = this->Makefile->GetDefinition(ruleVar)) {
          linkCmdStr += *rule;
        }
      }
      cmExpandList(linkCmdStr, linkCmds);
      if (this->UseLWYU) {
        cmValue lwyuCheck = mf->GetDefinition("CMAKE_LINK_WHAT_YOU_USE_CHECK");
        if (lwyuCheck) {
          std::string cmakeCommand = cmStrCat(
            this->GetLocalGenerator()->ConvertToOutputFormat(
              cmSystemTools::GetCMakeCommand(), cmLocalGenerator::SHELL),
            " -E __run_co_compile --lwyu=");
          cmakeCommand +=
            this->GetLocalGenerator()->EscapeForShell(*lwyuCheck);

          std::string targetOutputReal =
            this->ConvertToNinjaPath(this->GetGeneratorTarget()->GetFullPath(
              config, cmStateEnums::RuntimeBinaryArtifact,
              /*realname=*/true));
          cmakeCommand += cmStrCat(" --source=", targetOutputReal);
          linkCmds.push_back(std::move(cmakeCommand));
        }
      }
      return linkCmds;
    }
  }
  switch (this->GetGeneratorTarget()->GetType()) {
    case cmStateEnums::STATIC_LIBRARY: {
      // We have archive link commands set. First, delete the existing archive.
      {
        std::string cmakeCommand =
          this->GetLocalGenerator()->ConvertToOutputFormat(
            cmSystemTools::GetCMakeCommand(), cmOutputConverter::SHELL);
        linkCmds.push_back(cmakeCommand + " -E rm -f $TARGET_FILE");
      }
      // TODO: Use ARCHIVE_APPEND for archives over a certain size.
      {
        std::string linkCmdVar = cmStrCat(
          "CMAKE_", this->TargetLinkLanguage(config), "_ARCHIVE_CREATE");

        linkCmdVar = this->GeneratorTarget->GetFeatureSpecificLinkRuleVariable(
          linkCmdVar, this->TargetLinkLanguage(config), config);

        std::string const& linkCmd = mf->GetRequiredDefinition(linkCmdVar);
        cmExpandList(linkCmd, linkCmds);
      }
      {
        std::string linkCmdVar = cmStrCat(
          "CMAKE_", this->TargetLinkLanguage(config), "_ARCHIVE_FINISH");

        linkCmdVar = this->GeneratorTarget->GetFeatureSpecificLinkRuleVariable(
          linkCmdVar, this->TargetLinkLanguage(config), config);

        std::string const& linkCmd = mf->GetRequiredDefinition(linkCmdVar);
        cmExpandList(linkCmd, linkCmds);
      }
#ifdef __APPLE__
      // On macOS ranlib truncates the fractional part of the static archive
      // file modification time.  If the archive and at least one contained
      // object file were created within the same second this will make look
      // the archive older than the object file. On subsequent ninja runs this
      // leads to re-achiving and updating dependent targets.
      // As a work-around we touch the archive after ranlib (see #19222).
      {
        std::string cmakeCommand =
          this->GetLocalGenerator()->ConvertToOutputFormat(
            cmSystemTools::GetCMakeCommand(), cmOutputConverter::SHELL);
        linkCmds.push_back(cmakeCommand + " -E touch $TARGET_FILE");
      }
#endif
    } break;
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY:
      break;
    case cmStateEnums::EXECUTABLE:
      if (this->TargetLinkLanguage(config) == "Swift") {
        if (this->GeneratorTarget->IsExecutableWithExports()) {
          this->Makefile->GetDefExpandList("CMAKE_EXE_EXPORTS_Swift_FLAG",
                                           linkCmds);
        }
      }
      break;
    default:
      assert(false && "Unexpected target type");
  }
  return linkCmds;
}